

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sjio.cpp
# Opt level: O0

bool ReadBufData(void)

{
  stdin_log_t *this;
  const_iterator __first;
  bool bVar1;
  int iVar2;
  size_t sVar3;
  const_iterator __last;
  size_t *psVar4;
  reference __src;
  reference pvVar5;
  BOMmarkerDef *bomMarkerData;
  BOMmarkerDef *__end1;
  BOMmarkerDef *__begin1;
  BOMmarkerDef (*__range1) [5];
  difference_type local_40;
  long local_38;
  size_t local_30;
  long toCopy;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_20;
  const_iterator local_18;
  bool local_9;
  
  if (0x7fd < (long)(rlppos + -0x1e1bb0)) {
    Error("Line too long",(char *)0x0,FATAL);
  }
  if (rlpbuf < rlpbuf_end) {
    local_9 = true;
  }
  else if (((_stdin == FP_Input) && (pass != 1)) || (iVar2 = feof((FILE *)FP_Input), iVar2 == 0)) {
    rlpbuf = rlbuf;
    if ((pass == 1) || (_stdin != FP_Input)) {
      sVar3 = fread(rlbuf,1,0x1000,(FILE *)FP_Input);
      rlpbuf_end = rlbuf + sVar3;
      *rlpbuf_end = '\0';
    }
    this = stdin_log;
    if (_stdin == FP_Input) {
      if ((pass == 1) && (rlpbuf < rlpbuf_end)) {
        local_20._M_current = (char *)std::vector<char,_std::allocator<char>_>::end(stdin_log);
        __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
        __normal_iterator<char*>
                  ((__normal_iterator<char_const*,std::vector<char,std::allocator<char>>> *)
                   &local_18,&local_20);
        toCopy = (long)std::vector<char,std::allocator<char>>::insert<char*,void>
                                 ((vector<char,std::allocator<char>> *)this,local_18,rlpbuf,
                                  rlpbuf_end);
      }
      __first._M_current = stdin_read_it._M_current;
      if (1 < pass) {
        rlpbuf_end = rlpbuf;
        local_38 = 8000;
        __last = std::vector<char,_std::allocator<char>_>::cend(stdin_log);
        local_40 = std::
                   distance<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
                             ((__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>
                               )__first._M_current,
                              (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>
                               )__last._M_current);
        psVar4 = (size_t *)std::min<long>(&local_38,&local_40);
        local_30 = *psVar4;
        if (0 < (long)local_30) {
          __src = __gnu_cxx::
                  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>::
                  operator*(&stdin_read_it);
          memcpy(rlbuf,__src,local_30);
          __gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>::
          operator+=(&stdin_read_it,local_30);
          rlpbuf_end = rlpbuf_end + local_30;
        }
        *rlpbuf_end = '\0';
      }
    }
    bVar1 = std::vector<TextFilePos,_std::allocator<TextFilePos>_>::empty(&sourcePosStack);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      __assert_fail("!sourcePosStack.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/z00m128[P]sjasmplus/sjasm/sjio.cpp"
                    ,0x2c6,"bool ReadBufData()");
    }
    pvVar5 = std::vector<TextFilePos,_std::allocator<TextFilePos>_>::back(&sourcePosStack);
    if (pvVar5->line == 0) {
      for (__end1 = UtfBomMarkers; __end1 != (BOMmarkerDef *)"NO_COLOR"; __end1 = __end1 + 1) {
        if ((rlpbuf + __end1->length <= rlpbuf_end) &&
           (iVar2 = memcmp(rlpbuf,__end1->marker,__end1->length), iVar2 == 0)) {
          if (__end1 != UtfBomMarkers) {
            Error("Invalid UTF encoding detected (only ASCII and UTF8 works)",__end1->name,FATAL);
          }
          rlpbuf = rlpbuf + __end1->length;
        }
      }
      local_9 = rlpbuf < rlpbuf_end;
    }
    else {
      local_9 = rlpbuf < rlpbuf_end;
    }
  }
  else {
    local_9 = false;
  }
  return local_9;
}

Assistant:

static bool ReadBufData() {
	// check here also if `line` buffer is not full
	if ((LINEMAX-2) <= (rlppos - line)) Error("Line too long", NULL, FATAL);
	// now check for read data
	if (rlpbuf < rlpbuf_end) return 1;		// some data still in buffer
	// check EOF on files in every pass, stdin only in first, following will starve the stdin_log
	if ((stdin != FP_Input || 1 == pass) && feof(FP_Input)) return 0;	// no more data in file
	// read next block of data
	rlpbuf = rlbuf;
	// handle STDIN file differently (pass1 = read it, pass2+ replay "log" variable)
	if (1 == pass || stdin != FP_Input) {	// ordinary file is re-read every pass normally
		rlpbuf_end = rlbuf + fread(rlbuf, 1, 4096, FP_Input);
		*rlpbuf_end = 0;					// add zero terminator after new block
	}
	if (stdin == FP_Input) {
		// store copy of stdin into stdin_log during pass 1
		if (1 == pass && rlpbuf < rlpbuf_end) {
			stdin_log->insert(stdin_log->end(), rlpbuf, rlpbuf_end);
		}
		// replay the log in 2nd+ pass
		if (1 < pass) {
			rlpbuf_end = rlpbuf;
			long toCopy = std::min(8000L, (long)std::distance(stdin_read_it, stdin_log->cend()));
			if (0 < toCopy) {
				memcpy(rlbuf, &(*stdin_read_it), toCopy);
				stdin_read_it += toCopy;
				rlpbuf_end += toCopy;
			}
			*rlpbuf_end = 0;				// add zero terminator after new block
		}
	}
	// check UTF BOM markers only at the beginning of the file (source line == 0)
	assert(!sourcePosStack.empty());
	if (sourcePosStack.back().line) {
		return (rlpbuf < rlpbuf_end);		// return true if some data were read
	}
	//UTF BOM markers detector
	for (const auto & bomMarkerData : UtfBomMarkers) {
		if (rlpbuf_end < (rlpbuf + bomMarkerData.length)) continue;	// not enough bytes in buffer
		if (memcmp(rlpbuf, bomMarkerData.marker, bomMarkerData.length)) continue;	// marker not found
		if (&bomMarkerData != UtfBomMarkers) {	// UTF8 is first in the array, other markers show error
			Error("Invalid UTF encoding detected (only ASCII and UTF8 works)", bomMarkerData.name, FATAL);
		}
		rlpbuf += bomMarkerData.length;	// skip the UTF8 BOM marker
	}
	return (rlpbuf < rlpbuf_end);			// return true if some data were read
}